

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O3

lws_spa * lws_spa_create_via_info(lws *wsi,lws_spa_create_info_t *i)

{
  byte bVar1;
  lws_spa_fileupload_cb p_Var2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  lws_spa *spa;
  char *pcVar6;
  char **ppcVar7;
  lws_urldecode_stateful *plVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  size_t sVar12;
  lwsac **pplVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char local_108;
  char cStack_107;
  char cStack_106;
  char cStack_105;
  char cStack_104;
  char cStack_103;
  char cStack_102;
  char cStack_101;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  char local_f8;
  char cStack_f7;
  char cStack_f6;
  
  if (i->ac == (lwsac **)0x0) {
    spa = (lws_spa *)lws_zalloc(0x68,"spa");
  }
  else {
    spa = (lws_spa *)lwsac_use_zero(i->ac,0x68,i->ac_chunk_size);
  }
  if (spa == (lws_spa *)0x0) {
    return (lws_spa *)0x0;
  }
  iVar5 = i->count_params;
  iVar4 = i->max_storage;
  p_Var2 = i->opt_cb;
  pvVar3 = i->opt_data;
  sVar12 = i->param_names_stride;
  pplVar13 = i->ac;
  (spa->i).param_names = i->param_names;
  (spa->i).count_params = iVar5;
  (spa->i).max_storage = iVar4;
  (spa->i).ac_chunk_size = i->ac_chunk_size;
  (spa->i).param_names_stride = sVar12;
  (spa->i).ac = pplVar13;
  (spa->i).opt_cb = p_Var2;
  (spa->i).opt_data = pvVar3;
  iVar5 = (spa->i).max_storage;
  if (iVar5 == 0) {
    (spa->i).max_storage = 0x200;
    iVar5 = 0x200;
  }
  if (i->ac == (lwsac **)0x0) {
    pcVar6 = (char *)lws_realloc((void *)0x0,(long)iVar5,"spa");
  }
  else {
    pcVar6 = (char *)lwsac_use(i->ac,(long)iVar5,i->ac_chunk_size);
  }
  spa->storage = pcVar6;
  if (pcVar6 != (char *)0x0) {
    iVar5 = i->max_storage;
    spa->end = pcVar6 + (long)iVar5 + -1;
    if ((long)i->count_params == 0) {
LAB_00139b42:
      pplVar13 = (spa->i).ac;
      if (pplVar13 == (lwsac **)0x0) {
        plVar8 = (lws_urldecode_stateful *)lws_zalloc(0x240,"stateful urldecode");
      }
      else {
        plVar8 = (lws_urldecode_stateful *)lwsac_use_zero(pplVar13,0x240,(spa->i).ac_chunk_size);
      }
      if (plVar8 == (lws_urldecode_stateful *)0x0) {
        spa->s = (lws_urldecode_stateful *)0x0;
      }
      else {
        plVar8->out = pcVar6;
        plVar8->out_len = iVar5;
        plVar8->output = lws_urldecode_spa_cb;
        plVar8->pos = 0;
        plVar8->mp = 0;
        plVar8->sum = 0;
        plVar8->state = US_NAME;
        plVar8->name[0] = '\0';
        plVar8->data = spa;
        plVar8->wsi = wsi;
        iVar5 = lws_hdr_copy(wsi,&local_108,0xcd,WSI_TOKEN_HTTP_CONTENT_TYPE);
        if ((0 < iVar5) &&
           ((auVar16[0] = -(cStack_105 == 't'), auVar16[1] = -(cStack_104 == 'i'),
            auVar16[2] = -(cStack_103 == 'p'), auVar16[3] = -(cStack_102 == 'a'),
            auVar16[4] = -(cStack_101 == 'r'), auVar16[5] = -(cStack_100 == 't'),
            auVar16[6] = -(cStack_ff == '/'), auVar16[7] = -(cStack_fe == 'f'),
            auVar16[8] = -(cStack_fd == 'o'), auVar16[9] = -(cStack_fc == 'r'),
            auVar16[10] = -(cStack_fb == 'm'), auVar16[0xb] = -(cStack_fa == '-'),
            auVar16[0xc] = -(cStack_f9 == 'd'), auVar16[0xd] = -(local_f8 == 'a'),
            auVar16[0xe] = -(cStack_f7 == 't'), auVar16[0xf] = -(cStack_f6 == 'a'),
            auVar14[0] = -(local_108 == 'm'), auVar14[1] = -(cStack_107 == 'u'),
            auVar14[2] = -(cStack_106 == 'l'), auVar14[3] = -(cStack_105 == 't'),
            auVar14[4] = -(cStack_104 == 'i'), auVar14[5] = -(cStack_103 == 'p'),
            auVar14[6] = -(cStack_102 == 'a'), auVar14[7] = -(cStack_101 == 'r'),
            auVar14[8] = -(cStack_100 == 't'), auVar14[9] = -(cStack_ff == '/'),
            auVar14[10] = -(cStack_fe == 'f'), auVar14[0xb] = -(cStack_fd == 'o'),
            auVar14[0xc] = -(cStack_fc == 'r'), auVar14[0xd] = -(cStack_fb == 'm'),
            auVar14[0xe] = -(cStack_fa == '-'), auVar14[0xf] = -(cStack_f9 == 'd'),
            auVar14 = auVar14 & auVar16,
            (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff ||
            (auVar15[0] = -(local_108 == 'm'), auVar15[1] = -(cStack_107 == 'u'),
            auVar15[2] = -(cStack_106 == 'l'), auVar15[3] = -(cStack_105 == 't'),
            auVar15[4] = -(cStack_104 == 'i'), auVar15[5] = -(cStack_103 == 'p'),
            auVar15[6] = -(cStack_102 == 'a'), auVar15[7] = -(cStack_101 == 'r'),
            auVar15[8] = -(cStack_100 == 't'), auVar15[9] = -(cStack_ff == '/'),
            auVar15[10] = -(cStack_fe == 'r'), auVar15[0xb] = -(cStack_fd == 'e'),
            auVar15[0xc] = -(cStack_fc == 'l'), auVar15[0xd] = -(cStack_fb == 'a'),
            auVar15[0xe] = -(cStack_fa == 't'), auVar15[0xf] = -(cStack_f9 == 'e'),
            auVar17[0] = -(local_f8 == 'd'), auVar17[1] = 0xff, auVar17[2] = 0xff, auVar17[3] = 0xff
            , auVar17[4] = 0xff, auVar17[5] = 0xff, auVar17[6] = 0xff, auVar17[7] = 0xff,
            auVar17[8] = 0xff, auVar17[9] = 0xff, auVar17[10] = 0xff, auVar17[0xb] = 0xff,
            auVar17[0xc] = 0xff, auVar17[0xd] = 0xff, auVar17[0xe] = 0xff, auVar17[0xf] = 0xff,
            auVar17 = auVar17 & auVar15,
            (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff)))) {
          plVar8->field_0x22c = plVar8->field_0x22c | 1;
          plVar8->state = MT_LOOK_BOUND_IN;
          plVar8->mp = 2;
          pcVar6 = strstr(&local_108,"boundary=");
          if (pcVar6 != (char *)0x0) {
            builtin_strncpy(plVar8->mime_boundary,"\r\n--",4);
            lVar10 = 0;
            do {
              bVar1 = pcVar6[lVar10 + 9];
              if (((ulong)bVar1 < 0x3c) && ((0x800000100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
              {
                uVar11 = lVar10 + 4;
                goto LAB_00139cc7;
              }
              plVar8->mime_boundary[lVar10 + 4] = bVar1;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 0x7b);
            uVar11 = 0x7f;
LAB_00139cc7:
            plVar8->mime_boundary[uVar11 & 0xffffffff] = '\0';
            _lws_log(4,"boundary \'%s\'\n");
          }
        }
        spa->s = plVar8;
        if ((long)i->count_params == 0) {
LAB_00139d1f:
          _lws_log(4,"%s: Created SPA %p\n","lws_spa_create_via_info",spa);
          return spa;
        }
        sVar12 = (long)i->count_params << 2;
        if (i->ac == (lwsac **)0x0) {
          piVar9 = (int *)lws_zalloc(sVar12,"spa param len");
        }
        else {
          piVar9 = (int *)lwsac_use_zero(i->ac,sVar12,i->ac_chunk_size);
        }
        spa->param_length = piVar9;
        if (piVar9 != (int *)0x0) goto LAB_00139d1f;
        lws_urldecode_s_destroy(spa,spa->s);
      }
      pplVar13 = i->ac;
      if (pplVar13 != (lwsac **)0x0) goto LAB_00139da7;
      lws_realloc(spa->params,0,"lws_free");
    }
    else {
      sVar12 = (long)i->count_params << 3;
      if (i->ac == (lwsac **)0x0) {
        ppcVar7 = (char **)lws_zalloc(sVar12,"spa params");
      }
      else {
        ppcVar7 = (char **)lwsac_use_zero(i->ac,sVar12,i->ac_chunk_size);
      }
      spa->params = ppcVar7;
      if (ppcVar7 != (char **)0x0) {
        pcVar6 = spa->storage;
        iVar5 = i->max_storage;
        goto LAB_00139b42;
      }
    }
    pplVar13 = i->ac;
    if (pplVar13 != (lwsac **)0x0) goto LAB_00139da7;
    lws_realloc(spa->storage,0,"lws_free");
  }
  pplVar13 = i->ac;
  if (pplVar13 == (lwsac **)0x0) {
    lws_realloc(spa,0,"lws_free");
    pplVar13 = i->ac;
    if (pplVar13 == (lwsac **)0x0) {
      return (lws_spa *)0x0;
    }
  }
LAB_00139da7:
  lwsac_free(pplVar13);
  return (lws_spa *)0x0;
}

Assistant:

struct lws_spa *
lws_spa_create_via_info(struct lws *wsi, const lws_spa_create_info_t *i)
{
	struct lws_spa *spa;

	if (i->ac)
		spa = lwsac_use_zero(i->ac, sizeof(*spa), i->ac_chunk_size);
	else
		spa = lws_zalloc(sizeof(*spa), "spa");

	if (!spa)
		return NULL;

	spa->i = *i;
	if (!spa->i.max_storage)
		spa->i.max_storage = 512;

	if (i->ac)
		spa->storage = lwsac_use(i->ac, spa->i.max_storage,
					 i->ac_chunk_size);
	else
		spa->storage = lws_malloc(spa->i.max_storage, "spa");

	if (!spa->storage)
		goto bail2;

	spa->end = spa->storage + i->max_storage - 1;

	if (i->count_params) {
		if (i->ac)
			spa->params = lwsac_use_zero(i->ac,
				sizeof(char *) * i->count_params, i->ac_chunk_size);
		else
			spa->params = lws_zalloc(sizeof(char *) * i->count_params,
					 "spa params");
		if (!spa->params)
			goto bail3;
	}

	spa->s = lws_urldecode_s_create(spa, wsi, spa->storage, i->max_storage,
					lws_urldecode_spa_cb);
	if (!spa->s)
		goto bail4;

	if (i->count_params) {
		if (i->ac)
			spa->param_length = lwsac_use_zero(i->ac,
				sizeof(int) * i->count_params, i->ac_chunk_size);
		else
			spa->param_length = lws_zalloc(sizeof(int) * i->count_params,
						"spa param len");
		if (!spa->param_length)
			goto bail5;
	}

	lwsl_notice("%s: Created SPA %p\n", __func__, spa);

	return spa;

bail5:
	lws_urldecode_s_destroy(spa, spa->s);
bail4:
	if (!i->ac)
		lws_free(spa->params);
bail3:
	if (!i->ac)
		lws_free(spa->storage);
bail2:
	if (!i->ac)
		lws_free(spa);

	if (i->ac)
		lwsac_free(i->ac);

	return NULL;
}